

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O0

int get_ref_frame_flags(SPEED_FEATURES *sf,int use_one_pass_rt_params,
                       YV12_BUFFER_CONFIG **ref_frames,int ext_ref_frame_flags)

{
  int local_3c;
  int j;
  int index;
  YV12_BUFFER_CONFIG *this_ref;
  int i;
  int flags;
  int ext_ref_frame_flags_local;
  YV12_BUFFER_CONFIG **ref_frames_local;
  int use_one_pass_rt_params_local;
  SPEED_FEATURES *sf_local;
  
  i = 1;
  flags = ext_ref_frame_flags;
  do {
    if (6 < i) {
      return flags;
    }
    if ((use_one_pass_rt_params == 0) || ("\x01\a\x05\x04\x06\x02\x03"[i] != '\x04')) {
      local_3c = i;
    }
    else {
      local_3c = (sf->rt_sf).use_nonrd_altref_frame + 1;
    }
    for (j = 0; j < local_3c; j = j + 1) {
      if ((ref_frames[i] == ref_frames[j]) &&
         ((flags & 1 << ("\x01\a\x05\x04\x06\x02\x03"[j] - 1U & 0x1f)) != 0)) {
        flags = (1 << ("\x01\a\x05\x04\x06\x02\x03"[i] - 1U & 0x1f) ^ 0xffffffffU) & flags;
        break;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

static inline int get_ref_frame_flags(const SPEED_FEATURES *const sf,
                                      const int use_one_pass_rt_params,
                                      const YV12_BUFFER_CONFIG **ref_frames,
                                      const int ext_ref_frame_flags) {
  // cpi->ext_flags.ref_frame_flags allows certain reference types to be
  // disabled by the external interface.  These are set by
  // av1_apply_encoding_flags(). Start with what the external interface allows,
  // then suppress any reference types which we have found to be duplicates.
  int flags = ext_ref_frame_flags;

  for (int i = 1; i < INTER_REFS_PER_FRAME; ++i) {
    const YV12_BUFFER_CONFIG *const this_ref = ref_frames[i];
    // If this_ref has appeared before, mark the corresponding ref frame as
    // invalid. For one_pass_rt mode, only disable GOLDEN_FRAME if it's the
    // same as LAST_FRAME or ALTREF_FRAME (if ALTREF is being used in nonrd).
    int index =
        (use_one_pass_rt_params && ref_frame_priority_order[i] == GOLDEN_FRAME)
            ? (1 + sf->rt_sf.use_nonrd_altref_frame)
            : i;
    for (int j = 0; j < index; ++j) {
      // If this_ref has appeared before (same as the reference corresponding
      // to lower index j), remove it as a reference only if that reference
      // (for index j) is actually used as a reference.
      if (this_ref == ref_frames[j] &&
          (flags & (1 << (ref_frame_priority_order[j] - 1)))) {
        flags &= ~(1 << (ref_frame_priority_order[i] - 1));
        break;
      }
    }
  }
  return flags;
}